

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal_test.c
# Opt level: O0

uint main(void)

{
  byte bVar1;
  uint *puVar2;
  uint *a_00;
  uint *a_01;
  uint *a_02;
  uint *r;
  uint *e;
  uint *w;
  uint *q;
  uint size;
  uint t_6;
  uint *actual;
  uint uStack_148;
  uint actual_len;
  uint c1 [6];
  uint local_128 [2];
  uint expected [4];
  uint t_5;
  uint *a_2;
  uint *puStack_f8;
  uint a_len;
  uint *G_2;
  uint *puStack_e8;
  uint g_len_2;
  uint *M;
  uint uStack_d8;
  uint m_len;
  uint v [6];
  uint t_4;
  uint *b_1;
  uint uStack_a8;
  uint b_len_1;
  uint a_1 [4];
  uint t_3;
  uint *b;
  uint uStack_78;
  uint b_len;
  uint a [6];
  uint t_2;
  uint *g_1;
  uint g_len_1;
  uint G_1 [2];
  uint t_1;
  uint *g;
  uint uStack_28;
  uint g_len;
  uint G [5];
  uint t;
  
  generate_gf();
  _uStack_28 = 0xe700000074;
  G[0] = 0xd8;
  G[1] = 0x1e;
  G[2] = 1;
  g._4_4_ = 0;
  register0x00000000 = generating_polynomial(2,(uint *)((long)&g + 4));
  bVar1 = AR_EQ(&uStack_28,register0x00000000,5);
  REQUIRE((uint)bVar1);
  REQUIRE((uint)(g._4_4_ == 5));
  vector_free(stack0xffffffffffffffc8);
  G_1[0] = 1;
  stack0xffffffffffffffbc = 0x100000002;
  g_1._0_4_ = 0;
  puVar2 = generating_polynomial(1,(uint *)&g_1);
  bVar1 = AR_EQ((uint *)((long)&g_1 + 4),puVar2,2);
  REQUIRE((uint)bVar1);
  REQUIRE((uint)((int)g_1 == 2));
  vector_free(puVar2);
  _uStack_78 = 0;
  a[0] = 0;
  a[1] = 0;
  a[2] = 0x68;
  a[3] = 0x69;
  b._4_4_ = 0;
  puVar2 = shift_msg_to_vec((uchar *)"hi",2,2,(uint *)((long)&b + 4));
  bVar1 = AR_EQ(&uStack_78,puVar2,6);
  REQUIRE((uint)bVar1);
  vector_free(puVar2);
  _uStack_a8 = 0;
  a_1[0] = 0x68;
  a_1[1] = 0x69;
  b_1._4_4_ = 0;
  puVar2 = shift_msg_to_vec((uchar *)"hi",2,1,(uint *)((long)&b_1 + 4));
  bVar1 = AR_EQ(&uStack_a8,puVar2,4);
  REQUIRE((uint)bVar1);
  vector_free(puVar2);
  v[5] = 2;
  _uStack_d8 = 0xd300000045;
  v[0] = 0xe4;
  v[1] = 0xcd;
  v[2] = 0;
  v[3] = 0;
  M._4_4_ = 0;
  puStack_e8 = shift_msg_to_vec((uchar *)"hi",2,2,(uint *)((long)&M + 4));
  G_2._4_4_ = 0;
  puStack_f8 = generating_polynomial(v[5],(uint *)((long)&G_2 + 4));
  a_2._4_4_ = 0;
  puVar2 = calculate_check_symbols
                     (puStack_e8,M._4_4_,puStack_f8,G_2._4_4_,v[5],(uint *)((long)&a_2 + 4));
  bVar1 = AR_EQ(&uStack_d8,puVar2,6);
  REQUIRE((uint)bVar1);
  vector_free(puStack_f8);
  vector_free(puVar2);
  vector_free(puStack_e8);
  local_128[0] = 0x82;
  local_128[1] = 0x99;
  expected[0] = 0xf5;
  expected[1] = 0x58;
  _uStack_148 = 0xd3000000c0;
  c1[0] = 0x2c;
  c1[1] = 0xcd;
  c1[2] = 0x68;
  c1[3] = 0x69;
  actual._4_4_ = 0;
  _size = calculate_syndrome(&uStack_148,6,2,(uint *)((long)&actual + 4));
  bVar1 = AR_EQ(_size,local_128,4);
  REQUIRE((uint)bVar1);
  REQUIRE((uint)(actual._4_4_ == 4));
  vector_free(_size);
  q._4_4_ = 2;
  q._0_4_ = 0;
  puVar2 = generating_polynomial(2,(uint *)&q);
  a_00 = generating_polynomial(q._4_4_,(uint *)0x0);
  a_01 = generating_polynomial(q._4_4_,(uint *)0x0);
  a_02 = generating_polynomial(q._4_4_,(uint *)0x0);
  bVar1 = AR_EQ(puVar2,a_00,(uint)q);
  REQUIRE((uint)bVar1);
  bVar1 = AR_EQ(a_00,a_01,(uint)q);
  REQUIRE((uint)bVar1);
  bVar1 = AR_EQ(a_01,a_02,(uint)q);
  REQUIRE((uint)bVar1);
  bVar1 = AR_EQ(a_02,puVar2,(uint)q);
  REQUIRE((uint)bVar1);
  vector_free(puVar2);
  vector_free(a_00);
  vector_free(a_01);
  vector_free(a_02);
  return total;
}

Assistant:

uint32_t main()
{
    generate_gf();

    { // generating_polynomial_test t=2
        uint32_t t = 2;
        uint32_t G[] = {116, 231, 216, 30, 1};
        uint32_t g_len = 0;
        uint32_t *g = generating_polynomial(t, &g_len);
        REQUIRE(AR_EQ(G, g, LEN(G)));
        REQUIRE(g_len == LEN(G));
        vector_free(g);
    }

    { // generating_polynomial_test t=1
        uint32_t t = 1;
        uint32_t G[] = {2, 1};
        uint32_t g_len = 0;
        uint32_t *g = generating_polynomial(t, &g_len);
        REQUIRE(AR_EQ(G, g, LEN(G)));
        REQUIRE(g_len == LEN(G));
        vector_free(g);
    }

    { // shift_msg_to_vec t=2
        uint32_t t = 2;
        uint32_t a[] = {0, 0, 0, 0, 104, 105};
        uint32_t b_len = 0;
        uint32_t *b = shift_msg_to_vec("hi", 2, t, &b_len);
        REQUIRE(AR_EQ(a, b, LEN(a)));
        vector_free(b);
    }

    { // shift_msg_to_vec t=1
        uint32_t t = 1;
        uint32_t a[] = {0, 0, 104, 105};
        uint32_t b_len = 0;
        uint32_t *b = shift_msg_to_vec("hi", 2, t, &b_len);
        REQUIRE(AR_EQ(a, b, LEN(a)));
        vector_free(b);
    }

    { // calculate_check_symbols t=2
        uint32_t t = 2;
        uint32_t v[] = {69, 211, 228, 205, 0, 0};
        uint32_t m_len = 0;
        uint32_t *M = shift_msg_to_vec("hi", 2, t, &m_len);
        uint32_t g_len = 0;
        uint32_t *G = generating_polynomial(t, &g_len);
        uint32_t a_len = 0;
        uint32_t *a = calculate_check_symbols(M, m_len, G, g_len, t, &a_len);
        REQUIRE(AR_EQ(v, a, LEN(v)));
        vector_free(G);
        vector_free(a);
        vector_free(M);
    }

    { // calculate syndrome test
        uint32_t t = 2;
        uint32_t expected[] = {130, 153, 245, 88};
        uint32_t c1[] = {192, 211, 44, 205, 104, 105};
        uint32_t actual_len = 0;
        uint32_t *actual = calculate_syndrome(c1, LEN(c1), t, &actual_len);
        REQUIRE(AR_EQ(actual, expected, LEN(expected)));
        REQUIRE(actual_len == LEN(expected));
        vector_free(actual);
    }

    { // generator test
        uint32_t t = 2;
        uint32_t size = 0;
        uint32_t *q = generating_polynomial(t, &size);
        uint32_t *w = generating_polynomial(t, NULL);
        uint32_t *e = generating_polynomial(t, NULL);
        uint32_t *r = generating_polynomial(t, NULL);

        REQUIRE(AR_EQ(q,w,size));
        REQUIRE(AR_EQ(w,e,size));
        REQUIRE(AR_EQ(e,r,size));
        REQUIRE(AR_EQ(r,q,size));

        vector_free(q);
        vector_free(w);
        vector_free(e);
        vector_free(r);
    }

    TEST_EXIT;
}